

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O0

void __thiscall OctreeTracer::Resize(OctreeTracer *this,uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  element_type *peVar4;
  VkExtent3D *pVVar5;
  Ptr<ImageView> *image_view;
  iterator access_queue;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  FrameResource *i;
  iterator __end2;
  iterator __begin2;
  vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_> *__range2;
  uint32_t beam_height;
  uint32_t beam_width;
  vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
  *in_stack_ffffffffffffff28;
  shared_ptr<myvk::Framebuffer> *in_stack_ffffffffffffff30;
  vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_> *this_00;
  VkImageAspectFlags in_stack_ffffffffffffff80;
  VkImageViewType in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  Ptr<ImageView> *in_stack_ffffffffffffff90;
  pointer sampler;
  pointer this_01;
  pointer pFVar6;
  element_type *in_stack_ffffffffffffffb8;
  __normal_iterator<OctreeTracer::FrameResource_*,_std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>_>
  local_28;
  uint32_t uVar7;
  uint32_t uVar8;
  
  *(undefined4 *)(in_RDI + 8) = in_ESI;
  *(undefined4 *)(in_RDI + 0xc) = in_EDX;
  uVar2 = get_beam_size(*(uint32_t *)(in_RDI + 8));
  uVar3 = get_beam_size(*(uint32_t *)(in_RDI + 0xc));
  std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>::operator[]
            ((vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_> *)
             (in_RDI + 0xb0),0);
  peVar4 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x163940);
  pVVar5 = myvk::ImageBase::GetExtent(&peVar4->super_ImageBase);
  if (pVVar5->width == uVar2) {
    std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>::
    operator[]((vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_> *)
               (in_RDI + 0xb0),0);
    peVar4 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x163970);
    pVVar5 = myvk::ImageBase::GetExtent(&peVar4->super_ImageBase);
    if (pVVar5->height == uVar3) {
      return;
    }
  }
  image_view = (Ptr<ImageView> *)(in_RDI + 0xb0);
  local_28._M_current =
       (FrameResource *)
       std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>::begin
                 (in_stack_ffffffffffffff28);
  access_queue = std::
                 vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>::
                 end(in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::
                 operator==<OctreeTracer::FrameResource_*,_std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>_>
                           ((__normal_iterator<OctreeTracer::FrameResource_*,_std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<OctreeTracer::FrameResource_*,_std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>_>
                             *)in_stack_ffffffffffffff28), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<OctreeTracer::FrameResource_*,_std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>_>
    ::operator*(&local_28);
    peVar4 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x163a07);
    (*(peVar4->super_ImageBase).super_DeviceObjectBase.super_Base._vptr_Base[2])();
    sampler = (pointer)0x0;
    this_01 = (pointer)0x0;
    pFVar6 = (pointer)0x0;
    in_stack_ffffffffffffff28 =
         (vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_> *)
         &stack0xffffffffffffff98;
    uVar7 = uVar3;
    uVar8 = uVar2;
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
           0x163a57);
    this_00 = in_stack_ffffffffffffff28;
    myvk::Image::CreateTexture2D
              ((Ptr<Device> *)in_stack_ffffffffffffffb8,(VkExtent2D *)CONCAT44(uVar3,uVar2),
               (uint32_t)((ulong)pFVar6 >> 0x20),(VkFormat)pFVar6,
               (VkImageUsageFlags)((ulong)this_01 >> 0x20),
               (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                *)access_queue._M_current);
    in_stack_ffffffffffffff30 = (shared_ptr<myvk::Framebuffer> *)&stack0xffffffffffffffb8;
    std::shared_ptr<myvk::Image>::operator=
              ((shared_ptr<myvk::Image> *)in_stack_ffffffffffffff30,
               (shared_ptr<myvk::Image> *)in_stack_ffffffffffffff28);
    std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x163ab3);
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            this_00);
    std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
              ((shared_ptr<myvk::ImageBase> *)in_stack_ffffffffffffff30,
               (shared_ptr<myvk::Image> *)in_stack_ffffffffffffff28);
    myvk::ImageView::Create
              ((Ptr<ImageBase> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    std::shared_ptr<myvk::ImageView>::operator=
              ((shared_ptr<myvk::ImageView> *)in_stack_ffffffffffffff30,
               (shared_ptr<myvk::ImageView> *)in_stack_ffffffffffffff28);
    std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x163b0c);
    std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x163b16);
    myvk::Framebuffer::Create((Ptr<RenderPass> *)CONCAT44(uVar8,uVar7),image_view);
    std::shared_ptr<myvk::Framebuffer>::operator=
              (in_stack_ffffffffffffff30,(shared_ptr<myvk::Framebuffer> *)in_stack_ffffffffffffff28)
    ;
    std::shared_ptr<myvk::Framebuffer>::~shared_ptr((shared_ptr<myvk::Framebuffer> *)0x163b58);
    std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x163b69);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              ((DescriptorSet *)this_01,(Ptr<Sampler> *)sampler,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<OctreeTracer::FrameResource_*,_std::vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>_>
    ::operator++(&local_28);
    uVar3 = uVar7;
    uVar2 = uVar8;
  }
  return;
}

Assistant:

void OctreeTracer::Resize(uint32_t width, uint32_t height) {
	m_width = width;
	m_height = height;

	uint32_t beam_width = get_beam_size(m_width), beam_height = get_beam_size(m_height);
	if (m_frame_resources[0].m_beam_image->GetExtent().width != beam_width ||
	    m_frame_resources[0].m_beam_image->GetExtent().height != beam_height) {
		for (auto &i : m_frame_resources) {
			i.m_beam_image = myvk::Image::CreateTexture2D(
			    i.m_beam_image->GetDevicePtr(), {beam_width, beam_height}, 1, VK_FORMAT_R32_SFLOAT,
			    VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT);
			i.m_beam_image_view = myvk::ImageView::Create(i.m_beam_image, VK_IMAGE_VIEW_TYPE_2D);
			i.m_beam_framebuffer = myvk::Framebuffer::Create(m_beam_render_pass, i.m_beam_image_view);
			i.m_descriptor_set->UpdateCombinedImageSampler(i.m_beam_sampler, i.m_beam_image_view, 0);
		}
	}
}